

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

UniValue *
JSONRPCRequestObj(UniValue *__return_storage_ptr__,string *strMethod,UniValue *params,UniValue *id)

{
  pointer pcVar1;
  string key;
  string key_00;
  string key_01;
  string key_02;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffdc8;
  _Alloc_hider in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined1 auVar2 [32];
  undefined1 in_stack_fffffffffffffde8 [56];
  undefined8 in_stack_fffffffffffffe20;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffe28;
  long in_stack_fffffffffffffe30;
  pointer in_stack_fffffffffffffe38;
  long *local_1b8 [2];
  long local_1a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<UniValue,_std::allocator<UniValue>_> local_180;
  long *local_168 [2];
  long local_158 [2];
  VType local_148;
  long *local_140 [2];
  long local_130 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<UniValue,_std::allocator<UniValue>_> local_108;
  long *local_f0 [2];
  long local_e0 [2];
  UniValue local_d0;
  long *local_78 [2];
  long local_68 [2];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"method","");
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_d0,strMethod);
  key._M_string_length = (size_type)in_stack_fffffffffffffdd0._M_p;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  key.field_2._8_8_ = in_stack_fffffffffffffde0;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe20;
  auVar2 = in_stack_fffffffffffffde8._8_32_;
  val.typ = in_stack_fffffffffffffde8._0_4_;
  val._4_4_ = in_stack_fffffffffffffde8._4_4_;
  val.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
  val.val._M_string_length = auVar2._8_8_;
  val.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8._40_8_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde8._48_8_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffe28;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffe30;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffe38;
  UniValue::pushKV(__return_storage_ptr__,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
    operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"params","");
  local_148 = params->typ;
  pcVar1 = (params->val)._M_dataplus._M_p;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,pcVar1,pcVar1 + (params->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120,&params->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_108,&params->values);
  key_00._M_string_length = (size_type)in_stack_fffffffffffffdd0._M_p;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  key_00.field_2._8_8_ = in_stack_fffffffffffffde0;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe20;
  auVar2 = in_stack_fffffffffffffde8._8_32_;
  val_00.typ = in_stack_fffffffffffffde8._0_4_;
  val_00._4_4_ = in_stack_fffffffffffffde8._4_4_;
  val_00.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
  val_00.val._M_string_length = auVar2._8_8_;
  val_00.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8._40_8_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde8._48_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe28;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe30;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe38;
  UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"id","");
  pcVar1 = (id->val)._M_dataplus._M_p;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,pcVar1,pcVar1 + (id->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,&id->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_180,&id->values);
  key_01._M_string_length = (size_type)in_stack_fffffffffffffdd0._M_p;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  key_01.field_2._8_8_ = in_stack_fffffffffffffde0;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe20;
  auVar2 = in_stack_fffffffffffffde8._8_32_;
  val_01.typ = in_stack_fffffffffffffde8._0_4_;
  val_01._4_4_ = in_stack_fffffffffffffde8._4_4_;
  val_01.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
  val_01.val._M_string_length = auVar2._8_8_;
  val_01.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8._40_8_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde8._48_8_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe28;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe30;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe38;
  UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  puVar3 = &stack0xfffffffffffffe30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe20,"jsonrpc","");
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            ((UniValue *)&stack0xfffffffffffffdc8,(char (*) [4])"2.0");
  key_02._M_string_length = (size_type)in_stack_fffffffffffffdd0._M_p;
  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  key_02.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  key_02.field_2._8_8_ = in_stack_fffffffffffffde0;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar3;
  auVar2 = in_stack_fffffffffffffde8._8_32_;
  val_02.typ = in_stack_fffffffffffffde8._0_4_;
  val_02._4_4_ = in_stack_fffffffffffffde8._4_4_;
  val_02.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
  val_02.val._M_string_length = auVar2._8_8_;
  val_02.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8._40_8_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde8._48_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe28;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe30;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe38;
  UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffdf0);
  if (in_stack_fffffffffffffdd0._M_p != &stack0xfffffffffffffde0) {
    operator_delete(in_stack_fffffffffffffdd0._M_p,in_stack_fffffffffffffde0 + 1);
  }
  if (puVar3 != &stack0xfffffffffffffe30) {
    operator_delete(puVar3,in_stack_fffffffffffffe30 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCRequestObj(const std::string& strMethod, const UniValue& params, const UniValue& id)
{
    UniValue request(UniValue::VOBJ);
    request.pushKV("method", strMethod);
    request.pushKV("params", params);
    request.pushKV("id", id);
    request.pushKV("jsonrpc", "2.0");
    return request;
}